

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

TimerId __thiscall
sznet::net::EventLoop::runEvery(EventLoop *this,double interval,TimerCallback *cb)

{
  TimerQueue *this_00;
  _Manager_type p_Var1;
  double dVar2;
  int64_t iVar3;
  TimerId TVar4;
  Timestamp local_68;
  Timestamp local_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  double local_30;
  
  local_30 = interval;
  local_60 = Timestamp::now();
  dVar2 = local_30 * 1000000.0;
  iVar3 = Timestamp::microSecondsSinceEpoch(&local_60);
  Timestamp::Timestamp(&local_68,(long)dVar2 + iVar3);
  this_00 = (this->m_timerQueue)._M_t.
            super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>._M_t.
            super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>.
            super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  TVar4 = TimerQueue::addTimer(this_00,(TimerCallback *)&local_58,local_68,local_30);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return TVar4;
}

Assistant:

TimerId EventLoop::runEvery(double interval, TimerCallback cb)
{
	Timestamp time(addTime(Timestamp::now(), interval));
	return m_timerQueue->addTimer(std::move(cb), time, interval);
}